

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O2

void __thiscall bwtil::cw_bwt::computeEmpiricalEntropy(cw_bwt *this)

{
  undefined1 auVar1 [16];
  reference pvVar2;
  unsigned_long uVar3;
  uint s;
  ulong __n;
  ulint i;
  ulong uVar4;
  double __x;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  double local_38;
  undefined1 extraout_var [56];
  
  this->Hk = 0.0;
  for (uVar4 = 0; uVar4 < this->number_of_contexts; uVar4 = uVar4 + 1) {
    uVar3 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4];
    if (uVar3 != 0) {
      local_38 = 0.0;
      for (__n = 0; __n < this->sigma; __n = __n + 1) {
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           ((this->frequencies).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar4,__n);
        auVar1 = vcvtusi2sd_avx512f(in_XMM2,*pvVar2);
        uVar3 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4];
        auVar6 = vcvtusi2sd_avx512f(in_XMM2,uVar3);
        __x = auVar1._0_8_ / auVar6._0_8_;
        if (0.0 < __x) {
          auVar5._0_8_ = log2(__x);
          auVar5._8_56_ = extraout_var;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_38;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = __x;
          auVar1 = vfnmadd231sd_fma(auVar6,auVar5._0_16_,auVar1);
          local_38 = auVar1._0_8_;
        }
      }
      auVar1 = vcvtusi2sd_avx512f(in_XMM2,uVar3);
      auVar6 = vcvtusi2sd_avx512f(in_XMM2,this->n);
      this->Hk = (auVar1._0_8_ * local_38) / auVar6._0_8_ + this->Hk;
    }
  }
  return;
}

Assistant:

void computeEmpiricalEntropy(){

		//warning:to be called AFTER initialization of structures

		Hk = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0=0;//0-order entropy of this context

				for(uint s=0;s<sigma;s++){//for each symbol in the alphabet

					double f = (double)frequencies[i].at(s)/(double)lengths[i];

					if(f>0)
						H0 += -f*log2(f);

				}

				Hk += H0*((double)lengths[i]/(double)n);

			}
		}

	}